

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char_t cVar1;
  char_t cVar2;
  bool bVar3;
  int iVar4;
  char_t *pattern;
  char_t *pcVar5;
  unspecified_bool_type p_Var6;
  unspecified_bool_type p_Var7;
  xpath_context *in_RDX;
  xpath_ast_node *in_RSI;
  undefined1 *in_RDI;
  xpath_stack *in_stack_00000058;
  xpath_context *in_stack_00000060;
  xpath_ast_node *in_stack_00000068;
  xpath_allocator_capture cr_4;
  xpath_ast_node *in_stack_000000d0;
  xpath_ast_node *in_stack_000000d8;
  xpath_ast_node *in_stack_000000e0;
  xpath_allocator_capture cr_3;
  xml_attribute attr;
  char_t *value_1;
  char_t *lit;
  char_t *value;
  xml_attribute a;
  xml_node n;
  xpath_string lang;
  xpath_allocator_capture cr_2;
  xpath_string rr_1;
  xpath_string lr_1;
  xpath_allocator_capture cr_1;
  xpath_string rr;
  xpath_string lr;
  xpath_allocator_capture cr;
  xpath_stack *in_stack_00000390;
  xpath_context *in_stack_00000398;
  xpath_ast_node *in_stack_000003a0;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  undefined4 in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda4;
  xml_node in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  bool local_1ea;
  bool local_1e9;
  xpath_node_set_raw local_1d8;
  xpath_allocator_capture local_1b8;
  xpath_string local_198 [2];
  nodeset_eval_t in_stack_fffffffffffffe9c;
  xpath_stack *in_stack_fffffffffffffea0;
  xml_attribute in_stack_fffffffffffffea8;
  xpath_ast_node *in_stack_fffffffffffffeb0;
  char *local_138;
  char_t *local_130;
  xml_attribute local_128;
  xml_node local_120;
  xpath_string local_118;
  xpath_allocator_capture local_100;
  xml_attribute local_e0;
  xpath_string local_d8;
  xpath_string local_c0;
  xpath_allocator_capture local_a8;
  xpath_string local_88;
  xpath_string local_60;
  xpath_allocator_capture local_48;
  xpath_stack *in_stack_ffffffffffffffd8;
  bool local_1;
  
  switch(*in_RDI) {
  case 1:
    bVar3 = eval_boolean(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_1e9 = true;
    if (!bVar3) {
      local_1e9 = eval_boolean(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    }
    local_1 = local_1e9;
    break;
  case 2:
    bVar3 = eval_boolean(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_1ea = false;
    if (bVar3) {
      local_1ea = eval_boolean(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    }
    local_1 = local_1ea;
    break;
  case 3:
    local_1 = compare_eq<pugi::impl::(anonymous_namespace)::equal_to>
                        ((xpath_ast_node *)cr_3._target,in_stack_000000e0,
                         (xpath_context *)in_stack_000000d8,(xpath_stack *)in_stack_000000d0,
                         (equal_to *)cr_4._state._error);
    break;
  case 4:
    local_1 = compare_eq<pugi::impl::(anonymous_namespace)::not_equal_to>
                        ((xpath_ast_node *)cr_3._target,in_stack_000000e0,
                         (xpath_context *)in_stack_000000d8,(xpath_stack *)in_stack_000000d0,
                         (not_equal_to *)cr_4._state._error);
    break;
  case 5:
    local_1 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                        (in_stack_000000d8,in_stack_000000d0,(xpath_context *)cr_4._state._error,
                         (xpath_stack *)cr_4._state._root_size,(less *)cr_4._state._root);
    break;
  case 6:
    local_1 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                        (in_stack_000000d8,in_stack_000000d0,(xpath_context *)cr_4._state._error,
                         (xpath_stack *)cr_4._state._root_size,(less *)cr_4._state._root);
    break;
  case 7:
    local_1 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                        (in_stack_000000d8,in_stack_000000d0,(xpath_context *)cr_4._state._error,
                         (xpath_stack *)cr_4._state._root_size,(less_equal *)cr_4._state._root);
    break;
  case 8:
    local_1 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                        (in_stack_000000d8,in_stack_000000d0,(xpath_context *)cr_4._state._error,
                         (xpath_stack *)cr_4._state._root_size,(less_equal *)cr_4._state._root);
    break;
  default:
    goto LAB_00ed2caf;
  case 0x14:
    if (in_RDI[1] == '\x04') {
      bVar3 = xpath_variable::get_boolean(*(xpath_variable **)(in_RDI + 0x20));
      return bVar3;
    }
LAB_00ed2caf:
    iVar4 = (int)(char)in_RDI[1];
    if (iVar4 == 1) {
      xpath_allocator_capture::xpath_allocator_capture
                (&local_1b8,(xpath_allocator *)(in_RDX->n)._node._root);
      eval_node_set(in_stack_fffffffffffffeb0,(xpath_context *)in_stack_fffffffffffffea8._attr,
                    in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      bVar3 = xpath_node_set_raw::empty(&local_1d8);
      local_1 = (bool)((bVar3 ^ 0xffU) & 1);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0xed2e36);
    }
    else if (iVar4 == 2) {
      eval_number(in_stack_00000068,in_stack_00000060,in_stack_00000058);
      local_1 = convert_number_to_boolean((double)CONCAT44(in_stack_fffffffffffffda4,iVar4));
    }
    else if (iVar4 == 3) {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)(local_198 + 1),
                 (xpath_allocator *)(in_RDX->n)._node._root);
      eval_string(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
      bVar3 = xpath_string::empty(local_198);
      local_1 = (bool)((bVar3 ^ 0xffU) & 1);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0xed2d8c);
    }
    else {
      local_1 = false;
    }
    break;
  case 0x22:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_48,(xpath_allocator *)(in_RDX->n)._node._root);
    eval_string(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
    eval_string(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
    pcVar5 = xpath_string::c_str(&local_60);
    pattern = xpath_string::c_str(&local_88);
    local_1 = starts_with(pcVar5,pattern);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0xed2752);
    break;
  case 0x23:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_a8,(xpath_allocator *)(in_RDX->n)._node._root);
    eval_string(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
    eval_string(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
    xpath_string::c_str(&local_c0);
    xpath_string::c_str(&local_d8);
    pcVar5 = find_substring((char_t *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                            (char_t *)
                            CONCAT17(in_stack_fffffffffffffd9f,
                                     CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)))
    ;
    local_1 = pcVar5 != (char_t *)0x0;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0xed284b);
    break;
  case 0x2d:
    local_1 = eval_boolean(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    break;
  case 0x2e:
    bVar3 = eval_boolean(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_1 = (bool)((bVar3 ^ 0xffU) & 1);
    break;
  case 0x2f:
    local_1 = true;
    break;
  case 0x30:
    local_1 = false;
    break;
  case 0x31:
    local_e0 = xpath_node::attribute((xpath_node *)in_RSI);
    p_Var7 = xml_attribute::operator_cast_to_function_pointer(&local_e0);
    if (p_Var7 != (unspecified_bool_type)0x0) {
      return false;
    }
    xpath_allocator_capture::xpath_allocator_capture
              (&local_100,(xpath_allocator *)(in_RDX->n)._node._root);
    eval_string(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
    local_120 = xpath_node::node((xpath_node *)
                                 CONCAT17(in_stack_fffffffffffffd9f,
                                          CONCAT16(in_stack_fffffffffffffd9e,
                                                   in_stack_fffffffffffffd98)));
    while (p_Var6 = xml_node::operator_cast_to_function_pointer(&local_120),
          p_Var6 != (unspecified_bool_type)0x0) {
      local_128 = xml_node::attribute((xml_node *)
                                      CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                                      (char_t *)in_stack_fffffffffffffdb0._root);
      p_Var7 = xml_attribute::operator_cast_to_function_pointer(&local_128);
      if (p_Var7 != (unspecified_bool_type)0x0) {
        local_130 = xml_attribute::value(&local_128);
        local_138 = xpath_string::c_str(&local_118);
        goto LAB_00ed2a15;
      }
      in_stack_fffffffffffffdb0 =
           xml_node::parent((xml_node *)
                            CONCAT17(in_stack_fffffffffffffd9f,
                                     CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)))
      ;
      local_120 = in_stack_fffffffffffffdb0;
    }
    local_1 = false;
    goto LAB_00ed2b67;
  case 0x3b:
    if (**(char **)(in_RDI + 0x10) != '\x12') {
      xpath_variable::get_string(*(xpath_variable **)(*(long *)(in_RDI + 0x10) + 0x20));
    }
    xpath_node::node((xpath_node *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
    xml_node::attribute((xml_node *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                        (char_t *)in_stack_fffffffffffffdb0._root);
    p_Var7 = xml_attribute::operator_cast_to_function_pointer
                       ((xml_attribute *)&stack0xfffffffffffffea8);
    in_stack_fffffffffffffda4 = in_stack_fffffffffffffda4 & 0xffffff;
    if (p_Var7 != (unspecified_bool_type)0x0) {
      xml_attribute::value((xml_attribute *)&stack0xfffffffffffffea8);
      bVar3 = strequal((char_t *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (char_t *)
                       CONCAT17(in_stack_fffffffffffffd9f,
                                CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
      in_stack_fffffffffffffda4 = in_stack_fffffffffffffda4 & 0xffffff;
      if (bVar3) {
        xml_attribute::name((xml_attribute *)&stack0xfffffffffffffea8);
        bVar3 = is_xpath_attribute((char_t *)
                                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        in_stack_fffffffffffffda4 = (uint)bVar3 << 0x18;
      }
    }
    local_1 = SUB41(in_stack_fffffffffffffda4 >> 0x18,0);
  }
  return local_1;
LAB_00ed2a15:
  if (*local_138 == '\0') goto LAB_00ed2ad7;
  cVar1 = tolower_ascii(*local_138);
  cVar2 = tolower_ascii(*local_130);
  if (cVar1 != cVar2) {
    local_1 = false;
    goto LAB_00ed2b67;
  }
  local_130 = local_130 + 1;
  local_138 = local_138 + 1;
  goto LAB_00ed2a15;
LAB_00ed2ad7:
  local_1 = true;
  if (*local_130 != '\0') {
    local_1 = *local_130 == '-';
  }
LAB_00ed2b67:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0xed2b74);
  return local_1;
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != NULL;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}